

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O1

Literal * __thiscall
wasm::Literal::sub(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  ulong uVar1;
  Literal local_28;
  
  uVar1 = (this->type).id;
  if (6 < uVar1) {
    __assert_fail("isBasic() && \"Basic type expected\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                  ,0x1c4,"BasicType wasm::Type::getBasic() const");
  }
  switch(uVar1 & 0xffffffff) {
  case 0:
  case 1:
  case 6:
    handle_unreachable("unexpected type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                       ,0x467);
  case 2:
    (__return_storage_ptr__->field_0).i32 = (this->field_0).i32 - (other->field_0).i32;
    (__return_storage_ptr__->type).id = 2;
    return __return_storage_ptr__;
  case 3:
    (__return_storage_ptr__->field_0).gcData.
    super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         ((long)(this->field_0).gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr - (other->field_0).i64);
    (__return_storage_ptr__->type).id = 3;
    return __return_storage_ptr__;
  case 4:
    if ((uVar1 != 4) || ((other->type).id != 4)) {
      __assert_fail("type == Type::f32",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                    ,0x12d,"float wasm::Literal::getf32() const");
    }
    local_28.field_0.i32 = (int32_t)(*(float *)&this->field_0 - *(float *)&other->field_0);
    local_28.type.id = 4;
    standardizeNaN(__return_storage_ptr__,&local_28);
    break;
  case 5:
    if ((uVar1 != 5) || ((other->type).id != 5)) {
      __assert_fail("type == Type::f64",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                    ,0x131,"double wasm::Literal::getf64() const");
    }
    local_28.field_0.i64 = (int64_t)(*(double *)&this->field_0 - *(double *)&other->field_0);
    local_28.type.id = 5;
    standardizeNaN(__return_storage_ptr__,&local_28);
    break;
  default:
    handle_unreachable("unexpected type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                       ,0x469);
  }
  ~Literal(&local_28);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::sub(const Literal& other) const {
  switch (type.getBasic()) {
    case Type::i32:
      return Literal(uint32_t(i32) - uint32_t(other.i32));
    case Type::i64:
      return Literal(uint64_t(i64) - uint64_t(other.i64));
    case Type::f32:
      return standardizeNaN(Literal(getf32() - other.getf32()));
    case Type::f64:
      return standardizeNaN(Literal(getf64() - other.getf64()));
    case Type::v128:
    case Type::none:
    case Type::unreachable:
      WASM_UNREACHABLE("unexpected type");
  }
  WASM_UNREACHABLE("unexpected type");
}